

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.h
# Opt level: O0

void __thiscall
Eigen::internal::BlockImpl_dense<const_Eigen::Array<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false,_true>::
BlockImpl_dense(BlockImpl_dense<const_Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                *this,Array<double,__1,_1,_0,__1,_1> *xpr,Index startRow,Index startCol,
               Index blockRows,Index blockCols)

{
  Scalar *pSVar1;
  Index IVar2;
  Index IVar3;
  Index blockCols_local;
  Index blockRows_local;
  Index startCol_local;
  Index startRow_local;
  Array<double,__1,_1,_0,__1,_1> *xpr_local;
  BlockImpl_dense<const_Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true> *this_local;
  
  pSVar1 = PlainObjectBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::data
                     (&xpr->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>);
  IVar2 = Array<double,_-1,_1,_0,_-1,_1>::innerStride(xpr);
  IVar3 = Array<double,_-1,_1,_0,_-1,_1>::outerStride(xpr);
  MapBase<Eigen::Block<const_Eigen::Array<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_0>::MapBase
            (&this->
              super_MapBase<Eigen::Block<const_Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
             ,pSVar1 + IVar2 * startRow + IVar3 * startCol,blockRows,blockCols);
  this->m_xpr = xpr;
  variable_if_dynamic<long,_-1>::variable_if_dynamic(&this->m_startRow,startRow);
  variable_if_dynamic<long,_0>::variable_if_dynamic
            ((variable_if_dynamic<long,_0> *)&this->field_0x28,startCol);
  init(this,(EVP_PKEY_CTX *)startCol);
  return;
}

Assistant:

BlockImpl_dense(XprType& xpr,
          Index startRow, Index startCol,
          Index blockRows, Index blockCols)
      : Base(xpr.data()+xpr.innerStride()*(XprTypeIsRowMajor?startCol:startRow) + xpr.outerStride()*(XprTypeIsRowMajor?startRow:startCol), blockRows, blockCols),
        m_xpr(xpr), m_startRow(startRow), m_startCol(startCol)
    {
      init();
    }